

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  undefined4 extraout_EAX;
  int iVar9;
  parasail_result_t *ppVar10;
  __m128i *palVar11;
  __m128i *ptr;
  int32_t *ptr_00;
  ulong uVar12;
  __m128i *ptr_01;
  int iVar13;
  int32_t t;
  __m128i *palVar14;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  char *__format;
  uint uVar22;
  uint uVar23;
  __m128i *palVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i alVar33;
  undefined1 auVar34 [16];
  uint uVar38;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  undefined1 auVar39 [16];
  int iVar45;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  uint uVar46;
  uint uVar47;
  int32_t iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  __m128i vH;
  __m128i vH_00;
  int32_t in_stack_fffffffffffffe58;
  __m128i *local_198;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  __m128i_32_t e;
  __m128i_32_t h;
  
  palVar24 = (__m128i *)(ulong)(uint)s1_beg;
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar15 = "profile";
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar15 = "profile->profile32.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar15 = "profile->matrix";
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar15 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar15 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "open";
        }
        else {
          if (-1 < gap) {
            uVar18 = uVar3 - 1;
            uVar28 = (ulong)uVar3 + 3 >> 2;
            uVar30 = (ulong)uVar18 % uVar28;
            iVar9 = (int)(uVar18 / uVar28);
            uVar20 = -open;
            uVar7 = ppVar5->min;
            uVar21 = 0x80000000 - uVar7;
            if (uVar7 != uVar20 && SBORROW4(uVar7,uVar20) == (int)(uVar7 + open) < 0) {
              uVar21 = open | 0x80000000;
            }
            uVar7 = 0x7ffffffe - ppVar5->max;
            ppVar10 = parasail_result_new_table1((uint)((ulong)uVar3 + 3) & 0x7ffffffc,s2Len);
            if (ppVar10 != (parasail_result_t *)0x0) {
              ppVar10->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar10->flag | 0x4420802;
              local_198 = parasail_memalign___m128i(0x10,uVar28);
              palVar11 = parasail_memalign___m128i(0x10,uVar28);
              ptr = parasail_memalign___m128i(0x10,uVar28);
              ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              uVar12 = 0;
              if ((ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0) &&
                  (palVar11 != (__m128i *)0x0 && local_198 != (__m128i *)0x0)) {
                iVar13 = s2Len + -1;
                iVar16 = 3 - iVar9;
                uVar21 = uVar21 + 1;
                uVar17 = (uint)uVar28;
                uVar22 = uVar20;
                for (; uVar12 != uVar28; uVar12 = uVar12 + 1) {
                  uVar23 = uVar22;
                  for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
                    uVar46 = 0;
                    if (s1_beg == 0) {
                      uVar46 = uVar23;
                    }
                    *(uint *)((long)&h + lVar25 * 4) = uVar46;
                    lVar26 = (long)(int)uVar46 - (ulong)(uint)open;
                    if (lVar26 < -0x7fffffff) {
                      lVar26 = -0x80000000;
                    }
                    *(int *)((long)&e + lVar25 * 4) = (int)lVar26;
                    uVar23 = uVar23 - gap * uVar17;
                  }
                  local_198[uVar12][0] = h.m[0];
                  local_198[uVar12][1] = h.m[1];
                  ptr[uVar12][0] = e.m[0];
                  ptr[uVar12][1] = e.m[1];
                  uVar22 = uVar22 - gap;
                  palVar24 = ptr;
                }
                *ptr_00 = 0;
                uVar22 = uVar20;
                for (uVar12 = 1; s2Len + 1 != uVar12; uVar12 = uVar12 + 1) {
                  uVar23 = 0;
                  if (s2_beg == 0) {
                    uVar23 = uVar22;
                  }
                  ptr_00[uVar12] = uVar23;
                  uVar22 = uVar22 - gap;
                }
                uVar12 = 0;
                uVar8 = (int)uVar30 * 0x10;
                auVar32._4_4_ = uVar21;
                auVar32._0_4_ = uVar21;
                auVar32._8_4_ = uVar21;
                auVar32._12_4_ = uVar21;
                palVar14 = (__m128i *)((ulong)(uVar17 - 1) * 0x10);
                auVar43 = auVar32;
                iVar27 = iVar13;
                uVar22 = uVar7;
                uVar23 = uVar7;
                uVar46 = uVar7;
                uVar47 = uVar7;
                do {
                  ptr_01 = palVar11;
                  uVar38 = (uint)palVar14;
                  if (uVar12 == (uint)s2Len) {
                    uVar20 = uVar21;
                    if (s2_end != 0) {
                      iVar9 = 0;
                      while( true ) {
                        uVar28 = auVar32._0_8_;
                        lVar25 = auVar32._8_8_;
                        if (iVar16 <= iVar9) break;
                        auVar32._0_8_ = uVar28 << 0x20;
                        auVar32._8_8_ = lVar25 << 0x20 | uVar28 >> 0x20;
                        iVar9 = iVar9 + 1;
                      }
                      uVar20 = auVar32._12_4_;
                    }
                    uVar40 = uVar18;
                    if (s1_end != 0) {
                      uVar38 = (uVar17 & 0x1fffffff) << 2;
                      for (uVar28 = 0; uVar38 != (uint)uVar28; uVar28 = uVar28 + 1) {
                        uVar41 = ((uint)uVar28 & 3) * uVar17 + ((uint)(uVar28 >> 2) & 0x3fffffff);
                        iVar9 = iVar27;
                        uVar42 = uVar20;
                        uVar29 = uVar40;
                        if (((int)uVar41 < (int)uVar3) &&
                           (uVar35 = *(uint *)((long)*local_198 + uVar28 * 4), iVar9 = iVar13,
                           uVar42 = uVar35, uVar29 = uVar41, (int)uVar35 <= (int)uVar20)) {
                          if ((int)uVar40 <= (int)uVar41) {
                            uVar41 = uVar40;
                          }
                          iVar9 = iVar27;
                          uVar42 = uVar20;
                          uVar29 = uVar40;
                          if (iVar27 == iVar13 && uVar35 == uVar20) {
                            uVar29 = uVar41;
                          }
                        }
                        uVar40 = uVar29;
                        uVar20 = uVar42;
                        iVar27 = iVar9;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar33 = local_198[uVar30];
                      iVar9 = 0;
                      while( true ) {
                        uVar30 = alVar33[0];
                        lVar25 = alVar33[1];
                        if (iVar16 <= iVar9) break;
                        alVar33[0] = uVar30 << 0x20;
                        alVar33[1] = lVar25 << 0x20 | uVar30 >> 0x20;
                        iVar9 = iVar9 + 1;
                      }
                      uVar20 = alVar33[1]._4_4_;
                      iVar27 = iVar13;
                      uVar40 = uVar18;
                      uVar38 = uVar8;
                    }
                    auVar34._0_4_ = -(uint)((int)uVar22 < (int)uVar21);
                    auVar34._4_4_ = -(uint)((int)uVar23 < (int)uVar21);
                    auVar34._8_4_ = -(uint)((int)uVar46 < (int)uVar21);
                    auVar34._12_4_ = -(uint)((int)uVar47 < (int)uVar21);
                    auVar44._0_4_ = -(uint)((int)uVar7 < auVar43._0_4_);
                    auVar44._4_4_ = -(uint)((int)uVar7 < auVar43._4_4_);
                    auVar44._8_4_ = -(uint)((int)uVar7 < auVar43._8_4_);
                    auVar44._12_4_ = -(uint)((int)uVar7 < auVar43._12_4_);
                    iVar9 = movmskps(uVar38,auVar44 | auVar34);
                    if (iVar9 != 0) {
                      *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                      uVar20 = 0;
                      iVar27 = 0;
                      uVar40 = 0;
                    }
                    ppVar10->score = uVar20;
                    ppVar10->end_query = uVar40;
                    ppVar10->end_ref = iVar27;
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(ptr_01);
                    parasail_free(local_198);
                    return ppVar10;
                  }
                  iVar45 = ppVar5->mapper[(byte)s2[uVar12]];
                  palVar11 = local_198 + (uVar17 - 1);
                  iVar51 = (int)(*palVar11)[0];
                  iVar53 = *(int *)((long)*palVar11 + 4);
                  iVar55 = (int)(*palVar11)[1];
                  iVar48 = ptr_00[uVar12];
                  lVar25 = 0;
                  uVar38 = uVar21;
                  uVar40 = uVar21;
                  uVar41 = uVar21;
                  uVar42 = uVar21;
                  for (uVar19 = 0; t = (int32_t)uVar12, uVar28 != uVar19; uVar19 = uVar19 + 1) {
                    piVar1 = (int *)((long)pvVar4 + lVar25 + (long)(int)(iVar45 * uVar17) * 0x10);
                    iVar49 = iVar48 + *piVar1;
                    iVar51 = iVar51 + piVar1[1];
                    iVar53 = iVar53 + piVar1[2];
                    iVar55 = iVar55 + piVar1[3];
                    piVar1 = (int *)((long)*ptr + lVar25);
                    iVar50 = *piVar1;
                    iVar52 = piVar1[1];
                    iVar54 = piVar1[2];
                    iVar56 = piVar1[3];
                    uVar29 = (iVar50 < (int)uVar38) * uVar38 |
                             (uint)(iVar50 >= (int)uVar38) * iVar50;
                    uVar35 = (iVar52 < (int)uVar40) * uVar40 |
                             (uint)(iVar52 >= (int)uVar40) * iVar52;
                    uVar36 = (iVar54 < (int)uVar41) * uVar41 |
                             (uint)(iVar54 >= (int)uVar41) * iVar54;
                    uVar37 = (iVar56 < (int)uVar42) * uVar42 |
                             (uint)(iVar56 >= (int)uVar42) * iVar56;
                    uVar29 = (uint)((int)uVar29 < iVar49) * iVar49 |
                             ((int)uVar29 >= iVar49) * uVar29;
                    uVar35 = (uint)((int)uVar35 < iVar51) * iVar51 |
                             ((int)uVar35 >= iVar51) * uVar35;
                    uVar36 = (uint)((int)uVar36 < iVar53) * iVar53 |
                             ((int)uVar36 >= iVar53) * uVar36;
                    uVar37 = (uint)((int)uVar37 < iVar55) * iVar55 |
                             ((int)uVar37 >= iVar55) * uVar37;
                    puVar2 = (uint *)((long)*ptr_01 + lVar25);
                    *puVar2 = uVar29;
                    puVar2[1] = uVar35;
                    puVar2[2] = uVar36;
                    puVar2[3] = uVar37;
                    iVar51 = auVar43._0_4_;
                    iVar53 = auVar43._4_4_;
                    iVar55 = auVar43._8_4_;
                    iVar49 = auVar43._12_4_;
                    uVar22 = (uint)(iVar50 < (int)uVar22) * iVar50 |
                             (iVar50 >= (int)uVar22) * uVar22;
                    uVar23 = (uint)(iVar52 < (int)uVar23) * iVar52 |
                             (iVar52 >= (int)uVar23) * uVar23;
                    uVar46 = (uint)(iVar54 < (int)uVar46) * iVar54 |
                             (iVar54 >= (int)uVar46) * uVar46;
                    uVar47 = (uint)(iVar56 < (int)uVar47) * iVar56 |
                             (iVar56 >= (int)uVar47) * uVar47;
                    uVar22 = ((int)uVar38 < (int)uVar22) * uVar38 |
                             ((int)uVar38 >= (int)uVar22) * uVar22;
                    uVar23 = ((int)uVar40 < (int)uVar23) * uVar40 |
                             ((int)uVar40 >= (int)uVar23) * uVar23;
                    uVar46 = ((int)uVar41 < (int)uVar46) * uVar41 |
                             ((int)uVar41 >= (int)uVar46) * uVar46;
                    uVar47 = ((int)uVar42 < (int)uVar47) * uVar42 |
                             ((int)uVar42 >= (int)uVar47) * uVar47;
                    uVar22 = ((int)uVar29 < (int)uVar22) * uVar29 |
                             ((int)uVar29 >= (int)uVar22) * uVar22;
                    uVar23 = ((int)uVar35 < (int)uVar23) * uVar35 |
                             ((int)uVar35 >= (int)uVar23) * uVar23;
                    uVar46 = ((int)uVar36 < (int)uVar46) * uVar36 |
                             ((int)uVar36 >= (int)uVar46) * uVar46;
                    uVar47 = ((int)uVar37 < (int)uVar47) * uVar37 |
                             ((int)uVar37 >= (int)uVar47) * uVar47;
                    vH[0] = uVar19 & 0xffffffff;
                    vH[1] = uVar28;
                    arr_store_si128(((ppVar10->field_4).rowcols)->score_row,vH,t,s2Len,
                                    (int32_t)palVar24,in_stack_fffffffffffffe58);
                    auVar43._4_4_ =
                         (iVar53 < (int)uVar35) * uVar35 | (uint)(iVar53 >= (int)uVar35) * iVar53;
                    auVar43._0_4_ =
                         (iVar51 < (int)uVar29) * uVar29 | (uint)(iVar51 >= (int)uVar29) * iVar51;
                    auVar43._8_4_ =
                         (iVar55 < (int)uVar36) * uVar36 | (uint)(iVar55 >= (int)uVar36) * iVar55;
                    auVar43._12_4_ =
                         (iVar49 < (int)uVar37) * uVar37 | (uint)(iVar49 >= (int)uVar37) * iVar49;
                    iVar49 = uVar29 - open;
                    iVar57 = uVar35 - open;
                    iVar58 = uVar36 - open;
                    iVar59 = uVar37 - open;
                    iVar50 = iVar50 - gap;
                    iVar52 = iVar52 - gap;
                    iVar54 = iVar54 - gap;
                    iVar56 = iVar56 - gap;
                    puVar2 = (uint *)((long)*ptr + lVar25);
                    *puVar2 = (uint)(iVar50 < iVar49) * iVar49 | (uint)(iVar50 >= iVar49) * iVar50;
                    puVar2[1] = (uint)(iVar52 < iVar57) * iVar57 | (uint)(iVar52 >= iVar57) * iVar52
                    ;
                    puVar2[2] = (uint)(iVar54 < iVar58) * iVar58 | (uint)(iVar54 >= iVar58) * iVar54
                    ;
                    puVar2[3] = (uint)(iVar56 < iVar59) * iVar59 | (uint)(iVar56 >= iVar59) * iVar56
                    ;
                    iVar51 = uVar38 - gap;
                    iVar53 = uVar40 - gap;
                    iVar55 = uVar41 - gap;
                    iVar50 = uVar42 - gap;
                    uVar38 = (uint)(iVar51 < iVar49) * iVar49 | (uint)(iVar51 >= iVar49) * iVar51;
                    uVar40 = (uint)(iVar53 < iVar57) * iVar57 | (uint)(iVar53 >= iVar57) * iVar53;
                    uVar41 = (uint)(iVar55 < iVar58) * iVar58 | (uint)(iVar55 >= iVar58) * iVar55;
                    uVar42 = (uint)(iVar50 < iVar59) * iVar59 | (uint)(iVar50 >= iVar59) * iVar50;
                    piVar1 = (int *)((long)*local_198 + lVar25);
                    iVar48 = *piVar1;
                    iVar51 = piVar1[1];
                    iVar53 = piVar1[2];
                    iVar55 = piVar1[3];
                    lVar25 = lVar25 + 0x10;
                  }
                  for (iVar51 = 0; iVar51 != 4; iVar51 = iVar51 + 1) {
                    uVar42 = uVar20;
                    if (s2_beg == 0) {
                      uVar42 = ptr_00[uVar12 + 1] - open;
                    }
                    uVar19 = 0;
                    palVar11 = ptr_01;
                    uVar29 = uVar41;
                    while (uVar41 = uVar40, uVar40 = uVar38, uVar38 = uVar42, uVar28 != uVar19) {
                      iVar53 = (int)(*palVar11)[0];
                      iVar55 = *(int *)((long)*palVar11 + 4);
                      iVar45 = (int)(*palVar11)[1];
                      iVar50 = *(int *)((long)*palVar11 + 0xc);
                      uVar42 = (iVar53 < (int)uVar38) * uVar38 |
                               (uint)(iVar53 >= (int)uVar38) * iVar53;
                      uVar35 = (iVar55 < (int)uVar40) * uVar40 |
                               (uint)(iVar55 >= (int)uVar40) * iVar55;
                      uVar36 = (iVar45 < (int)uVar41) * uVar41 |
                               (uint)(iVar45 >= (int)uVar41) * iVar45;
                      uVar37 = (iVar50 < (int)uVar29) * uVar29 |
                               (uint)(iVar50 >= (int)uVar29) * iVar50;
                      *(uint *)*palVar11 = uVar42;
                      *(uint *)((long)*palVar11 + 4) = uVar35;
                      *(uint *)(*palVar11 + 1) = uVar36;
                      *(uint *)((long)*palVar11 + 0xc) = uVar37;
                      uVar22 = ((int)uVar42 < (int)uVar22) * uVar42 |
                               ((int)uVar42 >= (int)uVar22) * uVar22;
                      uVar23 = ((int)uVar35 < (int)uVar23) * uVar35 |
                               ((int)uVar35 >= (int)uVar23) * uVar23;
                      uVar46 = ((int)uVar36 < (int)uVar46) * uVar36 |
                               ((int)uVar36 >= (int)uVar46) * uVar46;
                      uVar47 = ((int)uVar37 < (int)uVar47) * uVar37 |
                               ((int)uVar37 >= (int)uVar47) * uVar47;
                      iVar53 = auVar43._0_4_;
                      iVar55 = auVar43._4_4_;
                      iVar45 = auVar43._8_4_;
                      iVar50 = auVar43._12_4_;
                      vH_00[0] = uVar19 & 0xffffffff;
                      vH_00[1] = uVar28;
                      arr_store_si128(((ppVar10->field_4).rowcols)->score_row,vH_00,t,s2Len,
                                      (int32_t)palVar24,in_stack_fffffffffffffe58);
                      auVar43._4_4_ =
                           (iVar55 < (int)uVar35) * uVar35 | (uint)(iVar55 >= (int)uVar35) * iVar55;
                      auVar43._0_4_ =
                           (iVar53 < (int)uVar42) * uVar42 | (uint)(iVar53 >= (int)uVar42) * iVar53;
                      auVar43._8_4_ =
                           (iVar45 < (int)uVar36) * uVar36 | (uint)(iVar45 >= (int)uVar36) * iVar45;
                      auVar43._12_4_ =
                           (iVar50 < (int)uVar37) * uVar37 | (uint)(iVar50 >= (int)uVar37) * iVar50;
                      uVar29 = uVar29 - gap;
                      auVar31._0_4_ = -(uint)((int)(uVar42 - open) < (int)(uVar38 - gap));
                      auVar31._4_4_ = -(uint)((int)(uVar35 - open) < (int)(uVar40 - gap));
                      auVar31._8_4_ = -(uint)((int)(uVar36 - open) < (int)(uVar41 - gap));
                      auVar31._12_4_ = -(uint)((int)(uVar37 - open) < (int)uVar29);
                      iVar53 = movmskps(extraout_EAX,auVar31);
                      uVar19 = uVar19 + 1;
                      palVar11 = palVar11 + 1;
                      uVar42 = uVar38 - gap;
                      uVar38 = uVar40 - gap;
                      uVar40 = uVar41 - gap;
                      if (iVar53 == 0) goto LAB_00668e36;
                    }
                  }
LAB_00668e36:
                  palVar11 = ptr_01 + uVar30;
                  iVar51 = (int)(*palVar11)[0];
                  iVar53 = *(int *)((long)*palVar11 + 4);
                  iVar55 = (int)(*palVar11)[1];
                  iVar45 = *(int *)((long)*palVar11 + 0xc);
                  local_68 = auVar32._0_4_;
                  iStack_64 = auVar32._4_4_;
                  iStack_60 = auVar32._8_4_;
                  iStack_5c = auVar32._12_4_;
                  auVar39._0_4_ = -(uint)(local_68 < iVar51);
                  auVar39._4_4_ = -(uint)(iStack_64 < iVar53);
                  auVar39._8_4_ = -(uint)(iStack_60 < iVar55);
                  auVar39._12_4_ = -(uint)(iStack_5c < iVar45);
                  auVar6._4_4_ = -(uint)(iVar16 == 2);
                  auVar6._0_4_ = -(uint)(iVar16 == 3);
                  auVar6._8_4_ = -(uint)(iVar16 == 1);
                  auVar6._12_4_ = -(uint)(iVar9 == 3);
                  iVar50 = movmskps(uVar8,auVar39 & auVar6);
                  if (iVar50 != 0) {
                    iVar27 = t;
                  }
                  auVar32._0_4_ =
                       (uint)(local_68 < iVar51) * iVar51 | (uint)(local_68 >= iVar51) * local_68;
                  auVar32._4_4_ =
                       (uint)(iStack_64 < iVar53) * iVar53 | (uint)(iStack_64 >= iVar53) * iStack_64
                  ;
                  auVar32._8_4_ =
                       (uint)(iStack_60 < iVar55) * iVar55 | (uint)(iStack_60 >= iVar55) * iStack_60
                  ;
                  auVar32._12_4_ =
                       (uint)(iStack_5c < iVar45) * iVar45 | (uint)(iStack_5c >= iVar45) * iStack_5c
                  ;
                  uVar12 = uVar12 + 1;
                  palVar11 = local_198;
                  palVar14 = ptr_01;
                  local_198 = ptr_01;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar15 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_striped_profile_sse41_128_32",pcVar15);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}